

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void MirrorSplitUVRow_SSSE3(uint8_t *src,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  bool bVar1;
  uvec8 auVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined1 (*pauVar6) [16];
  undefined1 auVar7 [16];
  
  auVar2 = libyuv::kShuffleMirrorSplitUV;
  pauVar6 = (undefined1 (*) [16])(src + (long)width * 2 + -0x10);
  lVar5 = (long)dst_v - (long)dst_u;
  lVar3 = (long)width;
  do {
    auVar7 = *pauVar6;
    pauVar6 = pauVar6 + -1;
    auVar7 = pshufb(auVar7,(undefined1  [16])auVar2);
    *(long *)dst_u = auVar7._0_8_;
    *(long *)(dst_u + lVar5) = auVar7._8_8_;
    dst_u = dst_u + 8;
    lVar4 = lVar3 + -8;
    bVar1 = 7 < lVar3;
    lVar3 = lVar4;
  } while (lVar4 != 0 && bVar1);
  return;
}

Assistant:

void MirrorSplitUVRow_SSSE3(const uint8_t* src,
                            uint8_t* dst_u,
                            uint8_t* dst_v,
                            int width) {
  intptr_t temp_width = (intptr_t)(width);
  asm volatile(
      "movdqa      %4,%%xmm1                     \n"
      "lea         -0x10(%0,%3,2),%0             \n"
      "sub         %1,%2                         \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "lea         -0x10(%0),%0                  \n"
      "pshufb      %%xmm1,%%xmm0                 \n"
      "movlpd      %%xmm0,(%1)                   \n"
      "movhpd      %%xmm0,0x00(%1,%2,1)          \n"
      "lea         0x8(%1),%1                    \n"
      "sub         $8,%3                         \n"
      "jg          1b                            \n"
      : "+r"(src),                  // %0
        "+r"(dst_u),                // %1
        "+r"(dst_v),                // %2
        "+r"(temp_width)            // %3
      : "m"(kShuffleMirrorSplitUV)  // %4
      : "memory", "cc", "xmm0", "xmm1");
}